

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

int __thiscall HighFreqPub::initialize(HighFreqPub *this,string *addr,int port)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  zsock_t *self;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  string newAddress;
  string front;
  string __str;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = std::__cxx11::string::compare((char *)addr);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_replace((ulong)addr,0,(char *)addr->_M_string_length,0x283731);
    port = 0xc001;
  }
  std::__cxx11::string::_M_assign((string *)this);
  plVar3 = (long *)std::__cxx11::string::append((char *)addr);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,*plVar3,plVar3[1] + *plVar3);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,local_90,local_88 + (long)local_90);
  uVar2 = -port;
  if (0 < port) {
    uVar2 = port;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar7 = (ulong)uVar2;
    uVar9 = 4;
    do {
      uVar8 = uVar9;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001719a4;
      }
      if (uVar4 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001719a4;
      }
      if (uVar4 < 10000) goto LAB_001719a4;
      uVar7 = uVar7 / 10000;
      uVar9 = uVar8 + 4;
    } while (99999 < uVar4);
    uVar8 = uVar8 + 1;
  }
LAB_001719a4:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar8 - (char)(port >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)port >> 0x1f) + (long)local_50[0]),uVar8,uVar2);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x284707);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_c0 = *plVar6;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar6;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  self = zsock_new_checked(1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                           ,0x21);
  this->hfPub = self;
  uVar2 = zsock_bind(self,"%s",local_b0[0]);
  if (uVar2 == 0xffffffff) {
    iVar1 = -1;
  }
  else {
    uVar8 = -uVar2;
    if (0 < (int)uVar2) {
      uVar8 = uVar2;
    }
    uVar9 = 1;
    if (9 < uVar8) {
      uVar7 = (ulong)uVar8;
      uVar4 = 4;
      do {
        uVar9 = uVar4;
        uVar5 = (uint)uVar7;
        if (uVar5 < 100) {
          uVar9 = uVar9 - 2;
          goto LAB_00171b94;
        }
        if (uVar5 < 1000) {
          uVar9 = uVar9 - 1;
          goto LAB_00171b94;
        }
        if (uVar5 < 10000) goto LAB_00171b94;
        uVar7 = uVar7 / 10000;
        uVar4 = uVar9 + 4;
      } while (99999 < uVar5);
      uVar9 = uVar9 + 1;
    }
LAB_00171b94:
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar9 - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d0),uVar9,uVar8);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0);
    std::__cxx11::string::_M_assign((string *)this);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    iVar1 = 0;
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return iVar1;
}

Assistant:

int HighFreqPub::initialize(std::string addr, int port) {
    if(addr == ""){
        addr = "tcp://127.0.0.1";
        port = 49153;
    }
    sockEndpoint = addr;
    std::string front = addr.append(":");
    std::string newAddress = front;
    newAddress += "*[" + std::to_string(port) + "-]"; // zsock_bind() takes in a port value of *[p-], which means bind to first available port starting at "p"
    hfPub = zsock_new(ZMQ_PUB);
    int aPort = zsock_bind(hfPub, "%s", newAddress.c_str()); //%s just reducing warnings, one at a time
    if(aPort == -1){
        return -1;
    }
    sockEndpoint = front.append(std::to_string(aPort));
    return 0;
}